

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_queue.h
# Opt level: O0

void __thiscall
CP::priority_queue<int,_std::less<int>_>::pop(priority_queue<int,_std::less<int>_> *this)

{
  size_t sVar1;
  out_of_range *this_00;
  priority_queue<int,_std::less<int>_> *this_local;
  
  sVar1 = size(this);
  if (sVar1 == 0) {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this_00,"index of out range");
    __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  *this->mData = this->mData[this->mSize - 1];
  this->mSize = this->mSize - 1;
  fixDown(this,0);
  return;
}

Assistant:

void pop() {
      if (size() == 0) throw std::out_of_range("index of out range");
      mData[0] = mData[mSize-1];
      mSize--;
      fixDown(0);
    }